

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  PyTypeObject *type_00;
  string local_d0;
  value_and_holder *local_b0;
  value_and_holder *vh;
  iterator __end2;
  iterator __begin2;
  values_and_holders *__range2;
  values_and_holders vhs;
  PyObject *self;
  PyObject *kwargs_local;
  PyObject *args_local;
  PyObject *type_local;
  
  vhs.tinfo = (type_vec *)(*___throw_system_error)(type,args,kwargs);
  if ((PyObject *)vhs.tinfo == (PyObject *)0x0) {
    type_local = (PyObject *)0x0;
  }
  else {
    pybind11::detail::values_and_holders::values_and_holders
              ((values_and_holders *)&__range2,(PyObject *)vhs.tinfo);
    pybind11::detail::values_and_holders::begin
              ((iterator *)&__end2.curr.vh,(values_and_holders *)&__range2);
    pybind11::detail::values_and_holders::end((iterator *)&vh,(values_and_holders *)&__range2);
    while (bVar2 = pybind11::detail::values_and_holders::iterator::operator!=
                             ((iterator *)&__end2.curr.vh,(iterator *)&vh), bVar2) {
      local_b0 = pybind11::detail::values_and_holders::iterator::operator*
                           ((iterator *)&__end2.curr.vh);
      bVar2 = pybind11::detail::value_and_holder::holder_constructed(local_b0);
      if ((!bVar2) &&
         (bVar2 = pybind11::detail::values_and_holders::is_redundant_value_and_holder
                            ((values_and_holders *)&__range2,local_b0), uVar1 = _PyExc_TypeError,
         !bVar2)) {
        pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                  (&local_d0,(detail *)local_b0->type->type,type_00);
        uVar3 = std::__cxx11::string::c_str();
        PyErr_Format(uVar1,"%.200s.__init__() must be called when overriding __init__",uVar3);
        std::__cxx11::string::~string((string *)&local_d0);
        _Py_DECREF((PyObject *)vhs.tinfo);
        return (PyObject *)0x0;
      }
      pybind11::detail::values_and_holders::iterator::operator++((iterator *)&__end2.curr.vh);
    }
    type_local = (PyObject *)vhs.tinfo;
  }
  return type_local;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // Ensure that the base __init__ function(s) were called
    values_and_holders vhs(self);
    for (const auto &vh : vhs) {
        if (!vh.holder_constructed() && !vhs.is_redundant_value_and_holder(vh)) {
            PyErr_Format(PyExc_TypeError,
                         "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}